

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

void rxa2_initial_hash(uint8_t *blockhash,argon2_context *context,argon2_type type)

{
  uint32_t in_EDX;
  long in_RSI;
  long in_RDI;
  uint8_t value [4];
  blake2b_state BlakeHash;
  undefined1 local_10c [4];
  size_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  blake2b_state *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff20;
  blake2b_state *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  blake2b_state *in_stack_ffffffffffffff48;
  
  if ((in_RSI != 0) && (in_RDI != 0)) {
    randomx_blake2b_init(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    store32(local_10c,*(uint32_t *)(in_RSI + 0x54));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    store32(local_10c,*(uint32_t *)(in_RSI + 8));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    store32(local_10c,*(uint32_t *)(in_RSI + 0x50));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    store32(local_10c,*(uint32_t *)(in_RSI + 0x4c));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    store32(local_10c,*(uint32_t *)(in_RSI + 0x5c));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    store32(local_10c,in_EDX);
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    store32(local_10c,*(uint32_t *)(in_RSI + 0x18));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (*(long *)(in_RSI + 0x10) != 0) {
      randomx_blake2b_update
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    store32(local_10c,*(uint32_t *)(in_RSI + 0x28));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (*(long *)(in_RSI + 0x20) != 0) {
      randomx_blake2b_update
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    store32(local_10c,*(uint32_t *)(in_RSI + 0x38));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (*(long *)(in_RSI + 0x30) != 0) {
      randomx_blake2b_update
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    store32(local_10c,*(uint32_t *)(in_RSI + 0x48));
    randomx_blake2b_update
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (*(long *)(in_RSI + 0x40) != 0) {
      randomx_blake2b_update
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    randomx_blake2b_final
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void rxa2_initial_hash(uint8_t *blockhash, argon2_context *context, argon2_type type) {
	blake2b_state BlakeHash;
	uint8_t value[sizeof(uint32_t)];

	if (NULL == context || NULL == blockhash) {
		return;
	}

	blake2b_init(&BlakeHash, ARGON2_PREHASH_DIGEST_LENGTH);

	store32(&value, context->lanes);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->outlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->m_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->t_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->version);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, (uint32_t)type);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->pwdlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->pwd != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->pwd,
			context->pwdlen);
	}

	store32(&value, context->saltlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->salt != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->salt, context->saltlen);
	}

	store32(&value, context->secretlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->secret != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->secret,
			context->secretlen);
	}

	store32(&value, context->adlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->ad != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->ad,
			context->adlen);
	}

	blake2b_final(&BlakeHash, blockhash, ARGON2_PREHASH_DIGEST_LENGTH);
}